

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall LLVMBC::ValueProxy::resolve(ValueProxy *this)

{
  ulong uVar1;
  ValueKind VVar2;
  size_type sVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  reference ppVVar6;
  ValueProxy *pVVar7;
  Value *pVVar8;
  bool bVar9;
  char local_2038 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  ValueProxy *this_local;
  
  if (this->proxy == (Value *)0x0) {
    uVar1 = this->id;
    sVar3 = std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::size
                      (&this->context->values);
    if (uVar1 < sVar3) {
      ppVVar6 = std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
                operator[](&this->context->values,this->id);
      this->proxy = *ppVVar6;
      while( true ) {
        bVar9 = false;
        if (this->proxy != (Value *)0x0) {
          VVar2 = Value::get_value_kind(this->proxy);
          bVar9 = VVar2 == Proxy;
        }
        if (!bVar9) break;
        pVVar7 = cast<LLVMBC::ValueProxy>(this->proxy);
        resolve(pVVar7);
        pVVar7 = cast<LLVMBC::ValueProxy>(this->proxy);
        pVVar8 = get_proxy_value(pVVar7);
        this->proxy = pVVar8;
      }
      if (this->proxy == (Value *)0x0) {
        p_Var4 = dxil_spv::get_thread_log_callback();
        if (p_Var4 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Failed to resolve proxy value.\n");
          fflush(_stderr);
        }
        else {
          snprintf(local_2038,0x1000,"Failed to resolve proxy value.\n");
          pvVar5 = dxil_spv::get_thread_log_callback_userdata();
          (*p_Var4)(pvVar5,Error,local_2038);
        }
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      p_Var4 = dxil_spv::get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Value proxy is out of range.\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&cb_1,0x1000,"Value proxy is out of range.\n");
        pvVar5 = dxil_spv::get_thread_log_callback_userdata();
        (*p_Var4)(pvVar5,Error,(char *)&cb_1);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ValueProxy::resolve()
{
	if (proxy)
		return true;

	if (id >= context.values.size())
	{
		LOGE("Value proxy is out of range.\n");
		return false;
	}

	proxy = context.values[id];
	while (proxy && proxy->get_value_kind() == ValueKind::Proxy)
	{
		cast<ValueProxy>(proxy)->resolve();
		proxy = cast<ValueProxy>(proxy)->get_proxy_value();
	}

	if (!proxy)
	{
		LOGE("Failed to resolve proxy value.\n");
		return false;
	}
	return true;
}